

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O0

void Nwk_ManDfsNodes_rec(Nwk_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  int iVar1;
  bool bVar2;
  int local_24;
  Nwk_Obj_t *pNStack_20;
  int i;
  Nwk_Obj_t *pNext;
  Vec_Ptr_t *vNodes_local;
  Nwk_Obj_t *pObj_local;
  
  iVar1 = Nwk_ObjIsTravIdCurrent(pObj);
  if (iVar1 == 0) {
    Nwk_ObjSetTravIdCurrent(pObj);
    iVar1 = Nwk_ObjIsCi(pObj);
    if (iVar1 == 0) {
      iVar1 = Nwk_ObjIsNode(pObj);
      if (iVar1 == 0) {
        __assert_fail("Nwk_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkDfs.c"
                      ,0x169,"void Nwk_ManDfsNodes_rec(Nwk_Obj_t *, Vec_Ptr_t *)");
      }
      local_24 = 0;
      while( true ) {
        bVar2 = false;
        if (local_24 < pObj->nFanins) {
          pNStack_20 = pObj->pFanio[local_24];
          bVar2 = pNStack_20 != (Nwk_Obj_t *)0x0;
        }
        if (!bVar2) break;
        Nwk_ManDfsNodes_rec(pNStack_20,vNodes);
        local_24 = local_24 + 1;
      }
      Vec_PtrPush(vNodes,pObj);
    }
  }
  return;
}

Assistant:

void Nwk_ManDfsNodes_rec( Nwk_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
    Nwk_Obj_t * pNext;
    int i;
    if ( Nwk_ObjIsTravIdCurrent( pObj ) )
        return;
    Nwk_ObjSetTravIdCurrent( pObj );
    if ( Nwk_ObjIsCi(pObj) )
        return;
    assert( Nwk_ObjIsNode(pObj) );
    Nwk_ObjForEachFanin( pObj, pNext, i )
        Nwk_ManDfsNodes_rec( pNext, vNodes );
    Vec_PtrPush( vNodes, pObj );
}